

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.test.h
# Opt level: O0

void my_algorithm::testWeightDigraphAlgorithm(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  WeightedDigraph<int,_int> *pWVar4;
  ostream *poVar5;
  void *pvVar6;
  reference edge_00;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *edge_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *__range2_1;
  int i_3;
  int start;
  WeightedDigraphSPAcyclic<int,_int> a_sp_ac;
  int local_200 [26];
  reference pWStack_198;
  int i_2;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *edge;
  iterator __end2;
  iterator __begin2;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *__range2;
  undefined1 local_158 [4];
  int i_1;
  WeightedDigraphSPDijkstra<int,_int> a_sp_dij;
  int local_c8 [33];
  int local_44;
  undefined1 local_40 [4];
  int i;
  WeightedDigraph<int,_int> graph;
  
  data_structures::WeightedDigraph<int,_int>::WeightedDigraph((WeightedDigraph<int,_int> *)local_40)
  ;
  for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
    data_structures::WeightedGraph<int,_int>::addVertex
              ((WeightedGraph<int,_int> *)local_40,&local_44);
  }
  local_c8[0x1c] = 4;
  local_c8[0x1b] = 5;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     ((WeightedDigraph<int,_int> *)local_40,local_c8 + 0x1c,local_c8 + 0x1b,0x23);
  local_c8[0x1a] = 5;
  local_c8[0x19] = 4;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0x1a,local_c8 + 0x19,0x23);
  local_c8[0x18] = 4;
  local_c8[0x17] = 7;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0x18,local_c8 + 0x17,0x25);
  local_c8[0x16] = 5;
  local_c8[0x15] = 7;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0x16,local_c8 + 0x15,0x1c);
  local_c8[0x14] = 7;
  local_c8[0x13] = 5;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0x14,local_c8 + 0x13,0x1c);
  local_c8[0x12] = 5;
  local_c8[0x11] = 1;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0x12,local_c8 + 0x11,0x20);
  local_c8[0x10] = 0;
  local_c8[0xf] = 4;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0x10,local_c8 + 0xf,0x26);
  local_c8[0xe] = 0;
  local_c8[0xd] = 2;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0xe,local_c8 + 0xd,0x1a);
  local_c8[0xc] = 7;
  local_c8[0xb] = 3;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 0xc,local_c8 + 0xb,0x27);
  local_c8[10] = 1;
  local_c8[9] = 3;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 10,local_c8 + 9,0x1d);
  local_c8[8] = 2;
  local_c8[7] = 7;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 8,local_c8 + 7,0x22);
  local_c8[6] = 6;
  local_c8[5] = 2;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 6,local_c8 + 5,0x28);
  local_c8[4] = 3;
  local_c8[3] = 6;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 4,local_c8 + 3,0x34);
  local_c8[2] = 6;
  local_c8[1] = 0;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_c8 + 2,local_c8 + 1,0x3a);
  local_c8[0] = 6;
  a_sp_dij._queue._list._size._4_4_ = 4;
  data_structures::WeightedDigraph<int,_int>::addEdge
            (pWVar4,local_c8,(int *)((long)&a_sp_dij._queue._list._size + 4),0x5d);
  poVar5 = data_structures::operator<<((ostream *)&std::cout,(WeightedDigraph<int,_int> *)local_40);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"<---- WeightedDigraphSPDijkstra ---->");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  WeightedDigraphSPDijkstra<int,_int>::WeightedDigraphSPDijkstra
            ((WeightedDigraphSPDijkstra<int,_int> *)local_158,(WeightedDigraph<int,_int> *)local_40,
             0);
  for (__range2._4_4_ = 0; __range2._4_4_ < 8; __range2._4_4_ = __range2._4_4_ + 1) {
    bVar1 = WeightedDigraphSPDijkstra<int,_int>::hasPathTo
                      ((WeightedDigraphSPDijkstra<int,_int> *)local_158,__range2._4_4_);
    if (bVar1) {
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0);
      poVar5 = std::operator<<(poVar5," to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,__range2._4_4_);
      poVar5 = std::operator<<(poVar5,":");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"weight: ");
      iVar2 = WeightedDigraphSPDijkstra<int,_int>::weightTo
                        ((WeightedDigraphSPDijkstra<int,_int> *)local_158,__range2._4_4_);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar2);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"path: ");
      WeightedDigraphSPDijkstra<int,_int>::pathTo
                ((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  *)&__begin2,(WeightedDigraphSPDijkstra<int,_int> *)local_158,__range2._4_4_);
      __end2 = std::
               vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
               ::begin((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                        *)&__begin2);
      edge = (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
              *)std::
                vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                ::end((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                       *)&__begin2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
                                         *)&edge), bVar1) {
        pWStack_198 = __gnu_cxx::
                      __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
                      ::operator*(&__end2);
        poVar5 = data_structures::operator<<((ostream *)&std::cout,pWStack_198);
        std::operator<<(poVar5," ");
        __gnu_cxx::
        __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::~vector((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 *)&__begin2);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  pvVar6 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  data_structures::WeightedGraph<int,_int>::clear((WeightedGraph<int,_int> *)local_40);
  for (local_200[0x19] = 0; local_200[0x19] < 8; local_200[0x19] = local_200[0x19] + 1) {
    data_structures::WeightedGraph<int,_int>::addVertex
              ((WeightedGraph<int,_int> *)local_40,local_200 + 0x19);
  }
  local_200[0x18] = 5;
  local_200[0x17] = 4;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     ((WeightedDigraph<int,_int> *)local_40,local_200 + 0x18,local_200 + 0x17,0x23);
  local_200[0x16] = 4;
  local_200[0x15] = 7;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 0x16,local_200 + 0x15,0x25);
  local_200[0x14] = 5;
  local_200[0x13] = 7;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 0x14,local_200 + 0x13,0x1c);
  local_200[0x12] = 5;
  local_200[0x11] = 1;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 0x12,local_200 + 0x11,0x20);
  local_200[0x10] = 4;
  local_200[0xf] = 0;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 0x10,local_200 + 0xf,0x26);
  local_200[0xe] = 0;
  local_200[0xd] = 2;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 0xe,local_200 + 0xd,0x1a);
  local_200[0xc] = 3;
  local_200[0xb] = 7;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 0xc,local_200 + 0xb,0x27);
  local_200[10] = 1;
  local_200[9] = 3;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 10,local_200 + 9,0x1d);
  local_200[8] = 7;
  local_200[7] = 2;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 8,local_200 + 7,0x22);
  local_200[6] = 6;
  local_200[5] = 2;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 6,local_200 + 5,0x28);
  local_200[4] = 3;
  local_200[3] = 6;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 4,local_200 + 3,0x34);
  local_200[2] = 6;
  local_200[1] = 0;
  pWVar4 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar4,local_200 + 2,local_200 + 1,0x3a);
  local_200[0] = 6;
  a_sp_ac._reserve_post_nodes.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  data_structures::WeightedDigraph<int,_int>::addEdge
            (pWVar4,local_200,
             (int *)((long)&a_sp_ac._reserve_post_nodes.
                            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x5d);
  poVar5 = data_structures::operator<<((ostream *)&std::cout,(WeightedDigraph<int,_int> *)local_40);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"<---- WeightedDigraphSPAcyclic ---->");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  WeightedDigraphSPAcyclic<int,_int>::WeightedDigraphSPAcyclic
            ((WeightedDigraphSPAcyclic<int,_int> *)&i_3,(WeightedDigraph<int,_int> *)local_40);
  iVar2 = WeightedDigraphSPAcyclic<int,_int>::start((WeightedDigraphSPAcyclic<int,_int> *)&i_3);
  for (__range2_1._0_4_ = 0; (int)__range2_1 < 8; __range2_1._0_4_ = (int)__range2_1 + 1) {
    bVar1 = WeightedDigraphSPAcyclic<int,_int>::hasPathTo
                      ((WeightedDigraphSPAcyclic<int,_int> *)&i_3,(int)__range2_1);
    if (bVar1) {
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
      poVar5 = std::operator<<(poVar5," to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)__range2_1);
      poVar5 = std::operator<<(poVar5,":");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"weight: ");
      iVar3 = WeightedDigraphSPAcyclic<int,_int>::weightTo
                        ((WeightedDigraphSPAcyclic<int,_int> *)&i_3,(int)__range2_1);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar3);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"path: ");
      WeightedDigraphSPAcyclic<int,_int>::pathTo
                ((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  *)&__begin2_1,(WeightedDigraphSPAcyclic<int,_int> *)&i_3,(int)__range2_1);
      __end2_1 = std::
                 vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 ::begin((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                          *)&__begin2_1);
      edge_1 = (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
                *)std::
                  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  ::end((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                         *)&__begin2_1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
                                 *)&edge_1), bVar1) {
        edge_00 = __gnu_cxx::
                  __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
                  ::operator*(&__end2_1);
        poVar5 = data_structures::operator<<((ostream *)&std::cout,edge_00);
        std::operator<<(poVar5," ");
        __gnu_cxx::
        __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
        ::operator++(&__end2_1);
      }
      std::
      vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::~vector((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 *)&__begin2_1);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  WeightedDigraphSPAcyclic<int,_int>::~WeightedDigraphSPAcyclic
            ((WeightedDigraphSPAcyclic<int,_int> *)&i_3);
  WeightedDigraphSPDijkstra<int,_int>::~WeightedDigraphSPDijkstra
            ((WeightedDigraphSPDijkstra<int,_int> *)local_158);
  data_structures::WeightedDigraph<int,_int>::~WeightedDigraph
            ((WeightedDigraph<int,_int> *)local_40);
  return;
}

Assistant:

void testWeightDigraphAlgorithm() {
        WeightedDigraph<int, int> graph;
        for (int i = 0; i <= 7; i++) {
            graph.addVertex(i);
        }

        graph.addEdge(4, 5, 35)
            .addEdge(5, 4, 35)
            .addEdge(4, 7, 37)
            .addEdge(5, 7, 28)
            .addEdge(7, 5, 28)
            .addEdge(5, 1, 32)
            .addEdge(0, 4, 38)
            .addEdge(0, 2, 26)
            .addEdge(7, 3, 39)
            .addEdge(1, 3, 29)
            .addEdge(2, 7, 34)
            .addEdge(6, 2, 40)
            .addEdge(3, 6, 52)
            .addEdge(6, 0, 58)
            .addEdge(6, 4, 93);

        cout << graph << endl;

        cout << "<---- WeightedDigraphSPDijkstra ---->" << endl;
        auto a_sp_dij = WeightedDigraphSPDijkstra<int, int>(graph, 0);
        for (int i = 0; i <= 7; i++) {
            if (!a_sp_dij.hasPathTo(i)) {
                continue;
            }
            cout << 0 << " to " << i << ":" << endl;
            cout << "weight: " << a_sp_dij.weightTo(i) << endl;
            cout << "path: ";
            for (auto &edge: a_sp_dij.pathTo(i)) {
                cout << edge << " ";
            }
            cout << endl;
        }

        cout << endl << endl;

        graph.clear();
        for (int i = 0; i <= 7; i++) {
            graph.addVertex(i);
        }
        graph.addEdge(5, 4, 35)
            .addEdge(4, 7, 37)
            .addEdge(5, 7, 28)
            .addEdge(5, 1, 32)
            .addEdge(4, 0, 38)
            .addEdge(0, 2, 26)
            .addEdge(3, 7, 39)
            .addEdge(1, 3, 29)
            .addEdge(7, 2, 34)
            .addEdge(6, 2, 40)
            .addEdge(3, 6, 52)
            .addEdge(6, 0, 58)
            .addEdge(6, 4, 93);

        cout << graph << endl;

        cout << "<---- WeightedDigraphSPAcyclic ---->" << endl;
        auto a_sp_ac = WeightedDigraphSPAcyclic<int, int>(graph);
        auto start = a_sp_ac.start();
        for (int i = 0; i <= 7; i++) {
            if (!a_sp_ac.hasPathTo(i)) {
                continue;
            }
            cout << start << " to " << i << ":" << endl;
            cout << "weight: " << a_sp_ac.weightTo(i) << endl;
            cout << "path: ";
            for (auto &edge: a_sp_ac.pathTo(i)) {
                cout << edge << " ";
            }
            cout << endl;
        }

    }